

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

void __thiscall ParserTestNoExplicitOutput::Run(ParserTestNoExplicitOutput *this)

{
  Test *this_00;
  bool condition;
  string err;
  ManifestParser parser;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  ManifestParser local_68;
  
  ManifestParser::ManifestParser
            (&local_68,&(this->super_ParserTest).state,(FileReader *)0x0,(ManifestParserOptions)0x0)
  ;
  this_00 = g_current_test;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"rule cat\n  command = cat $in > $out\nbuild | imp : cat bar\n",
             &local_a9);
  condition = ManifestParser::ParseTest(&local_68,&local_a8,&local_88);
  testing::Test::Check
            (this_00,condition,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x3fd,
             "parser.ParseTest( \"rule cat\\n\" \"  command = cat $in > $out\\n\" \"build | imp : cat bar\\n\", &err)"
            );
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

TEST_F(ParserTest, NoExplicitOutput) {
  ManifestParser parser(&state, NULL);
  string err;
  EXPECT_TRUE(parser.ParseTest(
"rule cat\n"
"  command = cat $in > $out\n"
"build | imp : cat bar\n", &err));
}